

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzclose.c
# Opt level: O3

int gzclose(gzFile file)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (file == (gzFile)0x0) {
    return -2;
  }
  if (file[1].have == 0x1c4f) {
    uVar3 = 0xfffffffe;
    if ((file != (gzFile)0x0) && (file[1].have == 0x1c4f)) {
      if ((int)file[1].pos != 0) {
        inflateEnd((z_streamp)(file + 5));
        free(file[2].next);
        free(*(void **)(file + 2));
      }
      iVar1 = *(int *)((long)&file[4].next + 4);
      gz_error((gz_statep)file,0,(char *)0x0);
      free(file[1].next);
      iVar2 = close(*(int *)&file[1].field_0x4);
      free(file);
      uVar3 = -(uint)(iVar2 != 0) | (uint)(iVar1 != -5) * 5 - 5;
    }
    return uVar3;
  }
  iVar1 = gzclose_w(file);
  return iVar1;
}

Assistant:

int ZEXPORT gzclose(file)
    gzFile file;
{
#ifndef NO_GZCOMPRESS
    gz_statep state;

    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;

    return state->mode == GZ_READ ? gzclose_r(file) : gzclose_w(file);
#else
    return gzclose_r(file);
#endif
}